

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O3

long testDeserializeHeartbeat(int count)

{
  __time_t _Var1;
  __suseconds_t _Var2;
  string string;
  Heartbeat message;
  long *local_1b0 [2];
  long local_1a0 [2];
  timeval local_190;
  Heartbeat local_180;
  
  FIX42::Heartbeat::Heartbeat(&local_180);
  FIX::Message::toString_abi_cxx11_((int)local_1b0,(int)&local_180,8);
  gettimeofday(&local_190,(__timezone_ptr_t)0x0);
  _Var2 = local_190.tv_usec;
  _Var1 = local_190.tv_sec;
  if (0 < count) {
    do {
      FIX::Message::setString
                ((string *)&local_180,SUB81(local_1b0,0),(DataDictionary *)0x0,
                 (DataDictionary *)
                 s_dataDictionary._M_t.
                 super___uniq_ptr_impl<FIX::DataDictionary,_std::default_delete<FIX::DataDictionary>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_FIX::DataDictionary_*,_std::default_delete<FIX::DataDictionary>_>
                 .super__Head_base<0UL,_FIX::DataDictionary_*,_false>._M_head_impl);
      count = count + -1;
    } while (count != 0);
  }
  gettimeofday(&local_190,(__timezone_ptr_t)0x0);
  if (local_1b0[0] != local_1a0) {
    operator_delete(local_1b0[0],local_1a0[0] + 1);
  }
  FIX::Message::~Message((Message *)&local_180);
  return (local_190.tv_usec - (_Var2 + (long)((double)_Var1 * 1000000.0))) +
         (long)((double)local_190.tv_sec * 1000000.0);
}

Assistant:

long testDeserializeHeartbeat(int count) {
  FIX42::Heartbeat message;
  std::string string = message.toString();
  count = count - 1;

  long start = GetTickCount();
  for (int i = 0; i <= count; ++i) {
    message.setString(string, DONT_VALIDATE, s_dataDictionary.get());
  }
  return GetTickCount() - start;
}